

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

string_view __thiscall
bloaty::anon_unknown_0::ElfFile::GetRegion(ElfFile *this,uint64_t start,uint64_t n)

{
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  string_view sVar1;
  char *in_stack_fffffffffffffff0;
  
  sVar1._M_str = in_stack_fffffffffffffff0;
  sVar1._M_len = in_RDI;
  sVar1 = StrictSubstr(sVar1,in_RSI,in_RDX);
  return sVar1;
}

Assistant:

string_view GetRegion(uint64_t start, uint64_t n) const {
    return StrictSubstr(data_, start, n);
  }